

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O3

void __thiscall
ByteCodeGenerator::PushJumpCleanupForTry
          (ByteCodeGenerator *this,OpCode tryOp,ByteCodeLabel label,RegSlot regSlot1,
          RegSlot regSlot2)

{
  RealCount *pRVar1;
  JumpCleanupList *pJVar2;
  DListNodeBase<JumpCleanupInfo> *pDVar3;
  DListNode<JumpCleanupInfo> *pDVar4;
  
  pJVar2 = this->jumpCleanupList;
  pDVar4 = (DListNode<JumpCleanupInfo> *)
           new<Memory::ArenaAllocator>(0x30,pJVar2->allocator,0x364470);
  (pDVar4->data).loopNode = (ParseNode *)0x0;
  (pDVar4->data).loopId = 0;
  (pDVar4->data).tryOp = tryOp;
  (pDVar4->data).label = label;
  (pDVar4->data).regSlot1 = regSlot1;
  (pDVar4->data).regSlot2 = regSlot2;
  pDVar3 = (pJVar2->super_DListBase<JumpCleanupInfo,_RealCount>).
           super_DListNodeBase<JumpCleanupInfo>.next.base;
  (pDVar4->super_DListNodeBase<JumpCleanupInfo>).prev = pDVar3->prev;
  (pDVar4->super_DListNodeBase<JumpCleanupInfo>).next.base = pDVar3;
  *(DListNode<JumpCleanupInfo> **)pDVar3->prev = pDVar4;
  (pDVar3->prev).node = pDVar4;
  pRVar1 = &(pJVar2->super_DListBase<JumpCleanupInfo,_RealCount>).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void PushJumpCleanupForTry(
        Js::OpCode tryOp,
        Js::ByteCodeLabel label = 0,
        Js::RegSlot regSlot1 = Js::Constants::NoRegister,
        Js::RegSlot regSlot2 = Js::Constants::NoRegister)
    {
        this->jumpCleanupList->Prepend({nullptr, 0, tryOp, label, regSlot1, regSlot2});
    }